

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

vector<Pathie::Path,_std::allocator<Pathie::Path>_> *
Pathie::Path::get_xdg_dirlist
          (vector<Pathie::Path,_std::allocator<Pathie::Path>_> *__return_storage_ptr__,
          string *envvarname,string *defaultlist)

{
  int iVar1;
  char *pcVar2;
  string local_158 [32];
  Path local_138;
  string local_118 [32];
  Path local_f8;
  undefined1 local_d1;
  long local_d0;
  size_t lastpos;
  size_t pos;
  string local_b8 [32];
  Pathie local_98 [32];
  string local_78 [8];
  string envstr;
  char *env_value;
  string env_nstr;
  string *defaultlist_local;
  string *envvarname_local;
  vector<Pathie::Path,_std::allocator<Pathie::Path>_> *results;
  
  utf8_to_filename((Pathie *)&env_value,envvarname);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar2 = getenv(pcVar2);
  std::__cxx11::string::string(local_78);
  if ((pcVar2 == (char *)0x0) || (iVar1 = strcmp(pcVar2,""), iVar1 == 0)) {
    std::__cxx11::string::operator=(local_78,(string *)defaultlist);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,pcVar2,(allocator *)((long)&pos + 7));
    filename_to_utf8(local_98,(string *)local_b8);
    std::__cxx11::string::operator=(local_78,(string *)local_98);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
  }
  lastpos = 0;
  local_d0 = 0;
  local_d1 = 0;
  std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::vector(__return_storage_ptr__);
  while (lastpos = std::__cxx11::string::find((char *)local_78,0x118198),
        lastpos != 0xffffffffffffffff) {
    std::__cxx11::string::substr((ulong)local_118,(ulong)local_78);
    Path(&local_f8,local_118);
    std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::push_back
              (__return_storage_ptr__,&local_f8);
    ~Path(&local_f8);
    std::__cxx11::string::~string((string *)local_118);
    local_d0 = lastpos + 1;
    lastpos = lastpos + 1;
  }
  std::__cxx11::string::substr((ulong)local_158,(ulong)local_78);
  Path(&local_138,local_158);
  std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::push_back
            (__return_storage_ptr__,&local_138);
  ~Path(&local_138);
  std::__cxx11::string::~string((string *)local_158);
  local_d1 = 1;
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)&env_value);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Path> Path::get_xdg_dirlist(const std::string& envvarname, const std::string& defaultlist)
{
  std::string env_nstr = utf8_to_filename(envvarname); // environment is encoded the same as the filenames
  char* env_value = getenv(env_nstr.c_str());
  std::string envstr;
  if (env_value && strcmp(env_value, "") != 0)
    envstr = filename_to_utf8(env_value); // Encode entire env string to UTF-8
  else
    envstr = defaultlist;

  size_t pos = 0;
  size_t lastpos = 0;
  std::vector<Path> results;
  while ((pos = envstr.find(":")) != string::npos) {
    results.push_back(Path(envstr.substr(lastpos, pos))); // envstr is already UTF-8

    lastpos = pos + 1;
    pos++;
  }

  results.push_back(envstr.substr(lastpos));

  return results;
}